

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

void read_error(char *format,...)

{
  char local_428 [8];
  char buffer [1024];
  va_list args;
  char *format_local;
  
  buffer[0x3fc] = '0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  buffer[0x3f8] = '\b';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  if (fin == (FILE *)0x0) {
    vsnprintf(local_428,0x400,format,buffer + 0x3f8);
    fl_message("%s",local_428);
  }
  else {
    fprintf(_stderr,"%s:%d: ",fname,(ulong)(uint)lineno);
    vfprintf(_stderr,format,buffer + 0x3f8);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

void read_error(const char *format, ...) {
  va_list args;
  va_start(args, format);
  if (!fin) {
    char buffer[1024];
    vsnprintf(buffer, sizeof(buffer), format, args);
    fl_message("%s", buffer);
  } else {
    fprintf(stderr, "%s:%d: ", fname, lineno);
    vfprintf(stderr, format, args);
    fprintf(stderr, "\n");
  }
  va_end(args);
}